

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCataloger.cpp
# Opt level: O0

Action __thiscall
psy::C::NameCataloger::visitCompoundStatement(NameCataloger *this,CompoundStatementSyntax *node)

{
  pointer pNVar1;
  StatementListSyntax *local_20;
  StatementListSyntax *iter;
  CompoundStatementSyntax *node_local;
  NameCataloger *this_local;
  
  pNVar1 = std::unique_ptr<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>::
           operator->(&this->catalog_);
  NameCatalog::indexNodeAndMarkAsEncloser(pNVar1,(SyntaxNode *)node);
  for (local_20 = CompoundStatementSyntax::statements(node); local_20 != (StatementListSyntax *)0x0;
      local_20 = (local_20->
                 super_CoreSyntaxNodeList<psy::C::StatementSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::StatementSyntax_*>_>
                 ).
                 super_List<psy::C::StatementSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::StatementSyntax_*>_>
                 .next) {
    SyntaxVisitor::visit
              (&this->super_SyntaxVisitor,
               &((local_20->
                 super_CoreSyntaxNodeList<psy::C::StatementSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::StatementSyntax_*>_>
                 ).
                 super_List<psy::C::StatementSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::StatementSyntax_*>_>
                .value)->super_SyntaxNode);
  }
  pNVar1 = std::unique_ptr<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>::
           operator->(&this->catalog_);
  NameCatalog::dropEncloser(pNVar1);
  return Skip;
}

Assistant:

SyntaxVisitor::Action NameCataloger::visitCompoundStatement(const CompoundStatementSyntax* node)
{
    catalog_->indexNodeAndMarkAsEncloser(node);
    for (auto iter = node->statements(); iter; iter = iter->next)
        visit(iter->value);
    catalog_->dropEncloser();

    return Action::Skip;
}